

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O1

cmCTestGenericHandler * __thiscall
cmCTestSubmitCommand::InitializeHandler(cmCTestSubmitCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  bool bVar4;
  cmValue cVar5;
  cmCTestSubmitHandler *this_00;
  char *value;
  pointer name;
  pointer pcVar6;
  string_view arg;
  string_view arg_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  notesFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraFiles;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [24];
  _Base_ptr local_88;
  size_t sStack_80;
  Part local_74;
  cmCTestSubmitHandler *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  if ((this->SubmitURL)._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CTEST_SUBMIT_URL","");
    cVar5 = cmMakefile::GetDefinition(pcVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    cVar5.Value = &this->SubmitURL;
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  pcVar6 = auStack_a0 + 8;
  if (cVar5.Value == (string *)0x0) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_a8 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CTEST_DROP_METHOD","");
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropMethod",(string *)local_a8,
               (this->super_cmCTestHandlerCommand).Quiet);
    if (local_a8 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_a8 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CTEST_DROP_SITE_USER","");
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropSiteUser",(string *)local_a8,
               (this->super_cmCTestHandlerCommand).Quiet);
    if (local_a8 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_a8 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"CTEST_DROP_SITE_PASSWORD","");
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropSitePassword",(string *)local_a8,
               (this->super_cmCTestHandlerCommand).Quiet);
    if (local_a8 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_a8 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CTEST_DROP_SITE","");
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropSite",(string *)local_a8,(this->super_cmCTestHandlerCommand).Quiet
              );
    if (local_a8 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_a8 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CTEST_DROP_LOCATION","");
    cmCTest::SetCTestConfigurationFromCMakeVariable
              (pcVar1,pcVar2,"DropLocation",(string *)local_a8,
               (this->super_cmCTestHandlerCommand).Quiet);
    if (local_a8 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
    }
  }
  else {
    cmCTest::SetCTestConfiguration
              (pcVar1,"SubmitURL",cVar5.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_a8 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CTEST_CURL_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"CurlOptions",(string *)local_a8,
             (this->super_cmCTestHandlerCommand).Quiet);
  if (local_a8 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_a8 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"CTEST_SUBMIT_INACTIVITY_TIMEOUT","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"SubmitInactivityTimeout",(string *)local_a8,
             (this->super_cmCTestHandlerCommand).Quiet);
  if (local_a8 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_a8 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CTEST_NOTES_FILES","");
  cVar5 = cmMakefile::GetDefinition(pcVar2,(string *)local_a8);
  if (local_a8 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
  }
  if (cVar5.Value != (string *)0x0) {
    arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar5.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8,arg,false);
    cmCTest::GenerateNotesFile
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_a8 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CTEST_EXTRA_SUBMIT_FILES","");
  cVar5 = cmMakefile::GetDefinition(pcVar2,(string *)local_a8);
  if (local_a8 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
  }
  if (cVar5.Value != (string *)0x0) {
    arg_00._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
    arg_00._M_len = (cVar5.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&local_68,arg_00,false);
    bVar4 = cmCTest::SubmitExtraFiles
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,&local_68);
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
    }
    else {
      local_a8 = (undefined1  [8])pcVar6;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"problem submitting extra files.","");
      cmCommand::SetError((cmCommand *)this,(string *)local_a8);
      if (local_a8 != (undefined1  [8])pcVar6) {
        operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if (!bVar4) {
        return (cmCTestGenericHandler *)0x0;
      }
    }
  }
  this_00 = cmCTest::GetSubmitHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(this_00->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(this_00);
  if ((this->Files).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    auStack_a0._16_8_ = auStack_a0;
    auStack_a0._8_8_ = 0;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._0_8_ = (pointer)0x0;
    sStack_80 = 0;
    local_88 = (_Base_ptr)auStack_a0._16_8_;
    cmCTestSubmitHandler::SelectParts
              (this_00,(set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                        *)local_a8);
    std::
    _Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
    ::~_Rb_tree((_Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                 *)local_a8);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_a8,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                &(this->Files).
                 super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_payload._M_value.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(this->Files).
                super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_payload._M_value.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    cmCTestSubmitHandler::SelectFiles
              (this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
  }
  if ((this->Parts).
      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_engaged == true) {
    name = *(pointer *)
            &(this->Parts).
             super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_payload._M_value.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar3 = (this->Parts).
             super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_payload._M_value.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    auStack_a0._8_8_ = 0;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._0_8_ = (pointer)0x0;
    sStack_80 = 0;
    auStack_a0._16_8_ = (_Base_ptr)auStack_a0;
    local_88 = (_Base_ptr)auStack_a0;
    local_70 = this_00;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8;
    if (name != pbVar3) {
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8;
      do {
        local_74 = cmCTest::GetPartFromName
                             ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,name);
        std::
        _Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
        ::
        _M_insert_unique_<cmCTest::Part,std::_Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>::_Alloc_node>
                  ((_Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
                    *)local_a8,(_Base_ptr)auStack_a0,&local_74,(_Alloc_node *)&local_68);
        name = name + 1;
      } while (name != pbVar3);
    }
    this_00 = local_70;
    cmCTestSubmitHandler::SelectParts
              (local_70,(set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                         *)local_a8);
    std::
    _Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
    ::~_Rb_tree((_Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
                 *)local_a8);
  }
  pcVar6 = auStack_a0 + 8;
  if ((this->HttpHeaders).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->HttpHeaders).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_00->HttpHeaders,
                &(this->HttpHeaders).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  }
  local_a8 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"RetryDelay","");
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_a8,(cmValue)&this->RetryDelay);
  if (local_a8 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
  }
  local_a8 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"RetryCount","");
  cmCTestGenericHandler::SetOption
            (&this_00->super_cmCTestGenericHandler,(string *)local_a8,(cmValue)&this->RetryCount);
  if (local_a8 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
  }
  local_a8 = (undefined1  [8])pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"InternalTest","");
  value = "OFF";
  if (this->InternalTest != false) {
    value = "ON";
  }
  cmCTestGenericHandler::SetOption(&this_00->super_cmCTestGenericHandler,(string *)local_a8,value);
  if (local_a8 != (undefined1  [8])pcVar6) {
    operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
  }
  (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  if (this->CDashUpload == true) {
    local_a8 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CDashUploadFile","");
    cmCTestGenericHandler::SetOption
              (&this_00->super_cmCTestGenericHandler,(string *)local_a8,
               (cmValue)&this->CDashUploadFile);
    if (local_a8 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
    }
    local_a8 = (undefined1  [8])pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"CDashUploadType","");
    cmCTestGenericHandler::SetOption
              (&this_00->super_cmCTestGenericHandler,(string *)local_a8,
               (cmValue)&this->CDashUploadType);
    if (local_a8 != (undefined1  [8])pcVar6) {
      operator_delete((void *)local_a8,auStack_a0._8_8_ + 1);
    }
  }
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestSubmitCommand::InitializeHandler()
{
  cmValue submitURL = !this->SubmitURL.empty()
    ? cmValue(this->SubmitURL)
    : this->Makefile->GetDefinition("CTEST_SUBMIT_URL");

  if (submitURL) {
    this->CTest->SetCTestConfiguration("SubmitURL", *submitURL, this->Quiet);
  } else {
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropMethod", "CTEST_DROP_METHOD", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSiteUser", "CTEST_DROP_SITE_USER", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSitePassword", "CTEST_DROP_SITE_PASSWORD",
      this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropSite", "CTEST_DROP_SITE", this->Quiet);
    this->CTest->SetCTestConfigurationFromCMakeVariable(
      this->Makefile, "DropLocation", "CTEST_DROP_LOCATION", this->Quiet);
  }

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CurlOptions", "CTEST_CURL_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SubmitInactivityTimeout",
    "CTEST_SUBMIT_INACTIVITY_TIMEOUT", this->Quiet);

  cmValue notesFilesVariable =
    this->Makefile->GetDefinition("CTEST_NOTES_FILES");
  if (notesFilesVariable) {
    std::vector<std::string> notesFiles = cmExpandedList(*notesFilesVariable);
    this->CTest->GenerateNotesFile(notesFiles);
  }

  cmValue extraFilesVariable =
    this->Makefile->GetDefinition("CTEST_EXTRA_SUBMIT_FILES");
  if (extraFilesVariable) {
    std::vector<std::string> extraFiles = cmExpandedList(*extraFilesVariable);
    if (!this->CTest->SubmitExtraFiles(extraFiles)) {
      this->SetError("problem submitting extra files.");
      return nullptr;
    }
  }

  cmCTestSubmitHandler* handler = this->CTest->GetSubmitHandler();
  handler->Initialize();

  // If no FILES or PARTS given, *all* PARTS are submitted by default.
  //
  // If FILES are given, but not PARTS, only the FILES are submitted
  // and *no* PARTS are submitted.
  //  (This is why we select the empty "noParts" set in the
  //   if(this->Files) block below...)
  //
  // If PARTS are given, only the selected PARTS are submitted.
  //
  // If both PARTS and FILES are given, only the selected PARTS *and*
  // all the given FILES are submitted.

  // If given explicit FILES to submit, pass them to the handler.
  //
  if (this->Files) {
    // Intentionally select *no* PARTS. (Pass an empty set.) If PARTS
    // were also explicitly mentioned, they will be selected below...
    // But FILES with no PARTS mentioned should just submit the FILES
    // without any of the default parts.
    //
    handler->SelectParts(std::set<cmCTest::Part>());
    handler->SelectFiles(
      std::set<std::string>(this->Files->begin(), this->Files->end()));
  }

  // If a PARTS option was given, select only the named parts for submission.
  //
  if (this->Parts) {
    auto parts =
      cmMakeRange(*(this->Parts)).transform([this](std::string const& arg) {
        return this->CTest->GetPartFromName(arg);
      });
    handler->SelectParts(std::set<cmCTest::Part>(parts.begin(), parts.end()));
  }

  // Pass along any HTTPHEADER to the handler if this option was given.
  if (!this->HttpHeaders.empty()) {
    handler->SetHttpHeaders(this->HttpHeaders);
  }

  handler->SetOption("RetryDelay", this->RetryDelay);
  handler->SetOption("RetryCount", this->RetryCount);
  handler->SetOption("InternalTest", this->InternalTest ? "ON" : "OFF");

  handler->SetQuiet(this->Quiet);

  if (this->CDashUpload) {
    handler->SetOption("CDashUploadFile", this->CDashUploadFile);
    handler->SetOption("CDashUploadType", this->CDashUploadType);
  }
  return handler;
}